

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O3

void jinit_1pass_quantizer(j_decompress_ptr cinfo)

{
  uint uVar1;
  J_COLOR_SPACE JVar2;
  jpeg_error_mgr *pjVar3;
  bool bVar4;
  jpeg_color_quantizer *pjVar5;
  ulong uVar6;
  JSAMPARRAY ppJVar7;
  ulong uVar8;
  long lVar9;
  jpeg_error_mgr *pjVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  int iVar15;
  JDIMENSION JVar16;
  JDIMENSION JVar17;
  JDIMENSION JVar18;
  long lVar19;
  undefined4 uVar20;
  undefined1 auVar21 [16];
  int iVar22;
  uint uVar23;
  uint uVar25;
  uint uVar26;
  int iVar27;
  undefined1 auVar24 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  uint uVar32;
  undefined1 auVar30 [16];
  uint uVar33;
  undefined1 auVar31 [16];
  undefined1 auVar34 [16];
  uint uVar35;
  uint uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int local_54 [3];
  jpeg_color_quantizer *local_48;
  j_decompress_ptr local_40;
  ulong local_38;
  
  pjVar5 = (jpeg_color_quantizer *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x98);
  cinfo->cquantize = pjVar5;
  pjVar5->start_pass = start_pass_1_quant;
  pjVar5->finish_pass = finish_pass_1_quant;
  pjVar5->new_color_map = new_color_map_1_quant;
  pjVar5[3].finish_pass = (_func_void_j_decompress_ptr *)0x0;
  pjVar5[2].finish_pass = (_func_void_j_decompress_ptr *)0x0;
  if (4 < cinfo->out_color_components) {
    *(undefined8 *)&cinfo->err->msg_code = 0x400000037;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  iVar15 = cinfo->desired_number_of_colors;
  if (0x100 < iVar15) {
    *(undefined8 *)&cinfo->err->msg_code = 0x10000000039;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    iVar15 = cinfo->desired_number_of_colors;
  }
  pjVar5 = cinfo->cquantize;
  uVar1 = cinfo->out_color_components;
  JVar2 = cinfo->out_color_space;
  local_54[0] = rgb_green[JVar2];
  local_54[1] = rgb_red[JVar2];
  local_54[2] = rgb_blue[JVar2];
  lVar19 = (long)iVar15;
  uVar11 = 1;
  do {
    uVar6 = uVar11;
    uVar11 = uVar6 + 1;
    uVar8 = uVar11;
    iVar15 = uVar1 - 1;
    if (1 < (int)uVar1) {
      do {
        uVar8 = uVar8 * uVar11;
        iVar15 = iVar15 + -1;
      } while (iVar15 != 0);
    }
  } while ((long)uVar8 <= lVar19);
  if (uVar6 < 2) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x38;
    (pjVar3->msg_parm).i[0] = (int)uVar8;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  auVar24 = _DAT_0014b050;
  if ((int)uVar1 < 1) {
    JVar18 = 1;
  }
  else {
    lVar9 = (ulong)uVar1 - 1;
    auVar21._8_4_ = (int)lVar9;
    auVar21._0_8_ = lVar9;
    auVar21._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar20 = (undefined4)uVar6;
    lVar9 = 0;
    auVar21 = auVar21 ^ _DAT_0014b050;
    auVar28 = _DAT_0014b040;
    auVar29 = _DAT_0014b000;
    auVar30 = _DAT_0015b340;
    do {
      auVar37 = auVar30;
      auVar30 = auVar29 ^ auVar24;
      uVar23 = -(uint)(auVar21._0_4_ < auVar30._0_4_);
      iVar15 = auVar21._4_4_;
      uVar25 = -(uint)(iVar15 < auVar30._4_4_);
      uVar26 = -(uint)(auVar21._8_4_ < auVar30._8_4_);
      iVar22 = auVar21._12_4_;
      iVar27 = -(uint)(iVar22 < auVar30._12_4_);
      uVar32 = -(uint)(auVar30._4_4_ == iVar15);
      uVar33 = -(uint)(auVar30._12_4_ == iVar22);
      if ((~(uVar25 | uVar32 & uVar23) & 1) != 0) {
        *(undefined4 *)((long)&pjVar5[1].new_color_map + lVar9 + 4) = uVar20;
      }
      if (((((ushort)iVar27 | (ushort)uVar33 & (ushort)uVar26) ^ 0xffff) & 1) != 0) {
        *(undefined4 *)((long)&pjVar5[2].start_pass + lVar9) = uVar20;
      }
      auVar30 = auVar28 ^ auVar24;
      auVar34._0_4_ = -(uint)(auVar21._0_4_ < auVar30._0_4_);
      auVar34._4_4_ = -(uint)(iVar15 < auVar30._4_4_);
      auVar34._8_4_ = -(uint)(auVar21._8_4_ < auVar30._8_4_);
      auVar34._12_4_ = -(uint)(iVar22 < auVar30._12_4_);
      uVar35 = -(uint)(auVar30._4_4_ == iVar15);
      uVar36 = -(uint)(auVar30._12_4_ == iVar22);
      auVar41._4_4_ = uVar35;
      auVar41._0_4_ = uVar35;
      auVar41._8_4_ = uVar36;
      auVar41._12_4_ = uVar36;
      auVar38._4_4_ = auVar34._4_4_;
      auVar38._0_4_ = auVar34._4_4_;
      auVar38._8_4_ = auVar34._12_4_;
      auVar38._12_4_ = auVar34._12_4_;
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar39 = (auVar38 | auVar41 & auVar34) ^ auVar39;
      if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined4 *)((long)&pjVar5[2].start_pass + lVar9 + 4) = uVar20;
      }
      if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined4 *)((long)&pjVar5[2].color_quantize + lVar9) = uVar20;
      }
      auVar30._0_4_ = (undefined4)((ulong)auVar37._0_4_ * (uVar6 & 0xffffffff));
      auVar40._8_4_ = (undefined4)((auVar37._8_8_ & 0xffffffff) * (uVar6 & 0xffffffff));
      auVar40._4_4_ = auVar40._8_4_;
      auVar40._0_4_ = auVar30._0_4_;
      auVar40._12_4_ = (int)((ulong)auVar37._12_4_ * (uVar6 & 0xffffffff));
      auVar30._8_8_ = auVar40._8_8_;
      auVar30._4_4_ = (int)((ulong)auVar37._4_4_ * (uVar6 & 0xffffffff));
      lVar13 = auVar29._8_8_;
      auVar29._0_8_ = auVar29._0_8_ + 4;
      auVar29._8_8_ = lVar13 + 4;
      lVar13 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + 4;
      auVar28._8_8_ = lVar13 + 4;
      lVar9 = lVar9 + 0x10;
    } while ((ulong)(uVar1 + 3 >> 2) << 4 != lVar9);
    auVar31._0_4_ = uVar32 & uVar23;
    auVar31._4_4_ = uVar33 & uVar26;
    auVar31._8_4_ = uVar35 & auVar34._0_4_;
    auVar31._12_4_ = uVar36 & auVar34._8_4_;
    auVar24._4_4_ = iVar27;
    auVar24._0_4_ = uVar25;
    auVar24._8_4_ = auVar34._4_4_;
    auVar24._12_4_ = auVar34._12_4_;
    auVar24 = ~(auVar24 | auVar31) & auVar30 | auVar37 & (auVar24 | auVar31);
    uVar8 = ((ulong)auVar24._8_4_ * (ulong)auVar24._0_4_ & 0xffffffff) *
            ((ulong)auVar24._4_4_ * (ulong)auVar24._12_4_ & 0xffffffff);
    uVar11 = uVar8 & 0xffffffff;
    JVar18 = (JDIMENSION)uVar8;
    if (0 < (int)uVar1) {
      bVar14 = true;
      uVar8 = 0;
LAB_00131bab:
      do {
        iVar15 = (int)uVar8;
        if (cinfo->out_color_space == JCS_RGB) {
          iVar15 = local_54[uVar8];
        }
        iVar22 = *(int *)((long)&pjVar5[1].new_color_map + (long)iVar15 * 4 + 4);
        lVar9 = (long)iVar22 + 1;
        uVar6 = ((int)uVar11 / iVar22) * lVar9;
        if (uVar6 - lVar19 == 0 || (long)uVar6 < lVar19) {
          *(int *)((long)&pjVar5[1].new_color_map + (long)iVar15 * 4 + 4) = (int)lVar9;
          uVar8 = uVar8 + 1;
          bVar14 = false;
          uVar11 = uVar6 & 0xffffffff;
          if (uVar8 != uVar1) goto LAB_00131bab;
        }
        JVar18 = (JDIMENSION)uVar11;
        uVar8 = 0;
        bVar4 = !bVar14;
        bVar14 = true;
      } while (bVar4);
    }
  }
  iVar15 = cinfo->out_color_components;
  pjVar3 = cinfo->err;
  (pjVar3->msg_parm).i[0] = JVar18;
  if (iVar15 == 3) {
    (pjVar3->msg_parm).i[1] = *(int *)((long)&pjVar5[1].new_color_map + 4);
    (pjVar3->msg_parm).i[2] = *(int *)&pjVar5[2].start_pass;
    (pjVar3->msg_parm).i[3] = *(int *)((long)&pjVar5[2].start_pass + 4);
    iVar15 = 0x5e;
    pjVar10 = pjVar3;
  }
  else {
    pjVar10 = cinfo->err;
    iVar15 = 0x5f;
  }
  pjVar3->msg_code = iVar15;
  (*pjVar10->emit_message)((j_common_ptr)cinfo,1);
  ppJVar7 = (*cinfo->mem->alloc_sarray)((j_common_ptr)cinfo,1,JVar18,cinfo->out_color_components);
  iVar15 = cinfo->out_color_components;
  if (0 < iVar15) {
    lVar19 = 0;
    JVar17 = JVar18;
    do {
      iVar22 = *(int *)((long)&pjVar5[1].new_color_map + lVar19 * 4 + 4);
      JVar16 = (JDIMENSION)((long)(int)JVar17 / (long)iVar22);
      if (0 < (long)iVar22) {
        local_38 = (ulong)(iVar22 - 1U);
        lVar9 = 0;
        lVar13 = 0;
        do {
          if (lVar9 * (int)JVar16 < (long)(int)JVar18) {
            lVar12 = lVar13;
            do {
              if (0 < (int)JVar16) {
                uVar11 = 0;
                do {
                  ppJVar7[lVar19][uVar11 + lVar12] =
                       (JSAMPLE)((lVar9 * 0xff + (ulong)(iVar22 - 1U >> 1)) / local_38);
                  uVar11 = uVar11 + 1;
                } while (((long)(int)JVar17 / (long)iVar22 & 0xffffffffU) != uVar11);
              }
              lVar12 = lVar12 + (int)JVar17;
            } while (lVar12 < (int)JVar18);
          }
          lVar9 = lVar9 + 1;
          lVar13 = lVar13 + (int)JVar16;
        } while (lVar9 != iVar22);
        iVar15 = cinfo->out_color_components;
      }
      lVar19 = lVar19 + 1;
      JVar17 = JVar16;
      local_48 = pjVar5;
      local_40 = cinfo;
    } while (lVar19 < iVar15);
  }
  pjVar5[1].start_pass = (_func_void_j_decompress_ptr_boolean *)ppJVar7;
  *(JDIMENSION *)&pjVar5[1].color_quantize = JVar18;
  create_colorindex(cinfo);
  if (cinfo->dither_mode != JDITHER_FS) {
    return;
  }
  alloc_fs_workspace(cinfo);
  return;
}

Assistant:

GLOBAL(void)
jinit_1pass_quantizer(j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize;

  cquantize = (my_cquantize_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_cquantizer));
  cinfo->cquantize = (struct jpeg_color_quantizer *)cquantize;
  cquantize->pub.start_pass = start_pass_1_quant;
  cquantize->pub.finish_pass = finish_pass_1_quant;
  cquantize->pub.new_color_map = new_color_map_1_quant;
  cquantize->fserrors[0] = NULL; /* Flag FS workspace not allocated */
  cquantize->odither[0] = NULL; /* Also flag odither arrays not allocated */

  /* Make sure my internal arrays won't overflow */
  if (cinfo->out_color_components > MAX_Q_COMPS)
    ERREXIT1(cinfo, JERR_QUANT_COMPONENTS, MAX_Q_COMPS);
  /* Make sure colormap indexes can be represented by JSAMPLEs */
  if (cinfo->desired_number_of_colors > (MAXJSAMPLE + 1))
    ERREXIT1(cinfo, JERR_QUANT_MANY_COLORS, MAXJSAMPLE + 1);

  /* Create the colormap and color index table. */
  create_colormap(cinfo);
  create_colorindex(cinfo);

  /* Allocate Floyd-Steinberg workspace now if requested.
   * We do this now since it may affect the memory manager's space
   * calculations.  If the user changes to FS dither mode in a later pass, we
   * will allocate the space then, and will possibly overrun the
   * max_memory_to_use setting.
   */
  if (cinfo->dither_mode == JDITHER_FS)
    alloc_fs_workspace(cinfo);
}